

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O2

int spawn_tcp_server_helper(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  int64_t eval_b;
  int64_t eval_a;
  uv_tcp_t tcp;
  
  loop = uv_default_loop();
  iVar1 = uv_tcp_init(loop,&tcp);
  eval_a = (int64_t)iVar1;
  if (eval_a == 0) {
    iVar1 = uv_tcp_open(&tcp,3);
    eval_a = (int64_t)iVar1;
    if (eval_a == 0) {
      iVar1 = uv_listen((uv_stream_t *)&tcp,0x1000,(uv_connection_cb)0x0);
      eval_a = (int64_t)iVar1;
      if (eval_a == 0) {
        return 1;
      }
      uVar2 = 0x2af;
    }
    else {
      uVar2 = 0x2a9;
    }
  }
  else {
    uVar2 = 0x2a1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
          ,uVar2,"r","==","0",eval_a,"==",0);
  abort();
}

Assistant:

int spawn_tcp_server_helper(void) {
  uv_tcp_t tcp;
  uv_os_sock_t handle;
  int r;

  r = uv_tcp_init(uv_default_loop(), &tcp);
  ASSERT_OK(r);

#ifdef _WIN32
  handle = _get_osfhandle(3);
#else
  handle = 3;
#endif
  r = uv_tcp_open(&tcp, handle);
  ASSERT_OK(r);

  /* Make sure that we can listen on a socket that was
   * passed down from the parent process
   */
  r = uv_listen((uv_stream_t*) &tcp, SOMAXCONN, NULL);
  ASSERT_OK(r);

  return 1;
}